

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::DescriptorDatabaseTest_ConflictingExtensionError_Test::
DescriptorDatabaseTest_ConflictingExtensionError_Test
          (DescriptorDatabaseTest_ConflictingExtensionError_Test *this)

{
  DescriptorDatabaseTest_ConflictingExtensionError_Test *this_local;
  
  DescriptorDatabaseTest::DescriptorDatabaseTest(&this->super_DescriptorDatabaseTest);
  (this->super_DescriptorDatabaseTest).
  super_TestWithParam<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>.
  super_Test._vptr_Test =
       (_func_int **)&PTR__DescriptorDatabaseTest_ConflictingExtensionError_Test_029a4258;
  (this->super_DescriptorDatabaseTest).
  super_TestWithParam<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>.
  super_WithParamInterface<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>
  ._vptr_WithParamInterface =
       (_func_int **)&PTR__DescriptorDatabaseTest_ConflictingExtensionError_Test_029a4298;
  return;
}

Assistant:

TEST_P(DescriptorDatabaseTest, ConflictingExtensionError) {
  AddToDatabase(
      "name: \"foo.proto\" "
      "extension { name:\"foo\" label:LABEL_OPTIONAL type:TYPE_INT32 number:5 "
      "            extendee: \".Foo\" }");
  AddToDatabaseWithError(
      "name: \"bar.proto\" "
      "extension { name:\"bar\" label:LABEL_OPTIONAL type:TYPE_INT32 number:5 "
      "            extendee: \".Foo\" }");
}